

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

CURLHcode curl_easy_header(CURL *easy,char *name,size_t nameindex,uint type,int request,
                          curl_header **hout)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  Curl_header_store *local_70;
  Curl_header_store *pick;
  Curl_header_store *hs;
  size_t amount;
  size_t match;
  Curl_easy *data;
  Curl_llist_node *e_pick;
  Curl_llist_node *e;
  curl_header **hout_local;
  int request_local;
  uint type_local;
  size_t nameindex_local;
  char *name_local;
  CURL *easy_local;
  
  data = (Curl_easy *)0x0;
  amount = 0;
  hs = (Curl_header_store *)0x0;
  pick = (Curl_header_store *)0x0;
  local_70 = (Curl_header_store *)0x0;
  if ((((name == (char *)0x0) || (hout == (curl_header **)0x0)) || (easy == (CURL *)0x0)) ||
     (((0x1f < type || (type == 0)) || (request < -1)))) {
    easy_local._4_4_ = CURLHE_BAD_ARGUMENT;
  }
  else {
    sVar2 = Curl_llist_count((Curl_llist *)((long)easy + 0x1278));
    if (sVar2 == 0) {
      easy_local._4_4_ = CURLHE_NOHEADERS;
    }
    else if (*(int *)((long)easy + 0xc70) < request) {
      easy_local._4_4_ = CURLHE_NOREQUEST;
    }
    else {
      hout_local._0_4_ = request;
      if (request == -1) {
        hout_local._0_4_ = *(int *)((long)easy + 0xc70);
      }
      for (e_pick = Curl_llist_head((Curl_llist *)((long)easy + 0x1278));
          e_pick != (Curl_llist_node *)0x0; e_pick = Curl_node_next(e_pick)) {
        pick = (Curl_header_store *)Curl_node_elem(e_pick);
        iVar1 = curl_strequal(pick->name,name);
        if (((iVar1 != 0) && ((pick->type & type) != 0)) && (pick->request == (int)hout_local)) {
          hs = (Curl_header_store *)((long)&(hs->node)._list + 1);
          data = (Curl_easy *)e_pick;
          local_70 = pick;
        }
      }
      if (hs == (Curl_header_store *)0x0) {
        easy_local._4_4_ = CURLHE_MISSING;
      }
      else if (nameindex < hs) {
        if ((undefined1 *)nameindex == &hs[-1].field_0x37) {
          pick = local_70;
        }
        else {
          for (e_pick = Curl_llist_head((Curl_llist *)((long)easy + 0x1278));
              e_pick != (Curl_llist_node *)0x0; e_pick = Curl_node_next(e_pick)) {
            pick = (Curl_header_store *)Curl_node_elem(e_pick);
            iVar1 = curl_strequal(pick->name,name);
            if ((((iVar1 != 0) && ((pick->type & type) != 0)) && (pick->request == (int)hout_local))
               && (bVar3 = amount == nameindex, amount = amount + 1, bVar3)) {
              data = (Curl_easy *)e_pick;
              break;
            }
          }
          if (e_pick == (Curl_llist_node *)0x0) {
            return CURLHE_MISSING;
          }
        }
        copy_header_external
                  (pick,nameindex,(size_t)hs,(Curl_llist_node *)data,
                   (curl_header *)((long)easy + 0x1298));
        *hout = (curl_header *)((long)easy + 0x1298);
        easy_local._4_4_ = CURLHE_OK;
      }
      else {
        easy_local._4_4_ = CURLHE_BADINDEX;
      }
    }
  }
  return easy_local._4_4_;
}

Assistant:

CURLHcode curl_easy_header(CURL *easy,
                           const char *name,
                           size_t nameindex,
                           unsigned int type,
                           int request,
                           struct curl_header **hout)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *e_pick = NULL;
  struct Curl_easy *data = easy;
  size_t match = 0;
  size_t amount = 0;
  struct Curl_header_store *hs = NULL;
  struct Curl_header_store *pick = NULL;
  if(!name || !hout || !data ||
     (type > (CURLH_HEADER|CURLH_TRAILER|CURLH_CONNECT|CURLH_1XX|
              CURLH_PSEUDO)) || !type || (request < -1))
    return CURLHE_BAD_ARGUMENT;
  if(!Curl_llist_count(&data->state.httphdrs))
    return CURLHE_NOHEADERS; /* no headers available */
  if(request > data->state.requests)
    return CURLHE_NOREQUEST;
  if(request == -1)
    request = data->state.requests;

  /* we need a first round to count amount of this header */
  for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
    hs = Curl_node_elem(e);
    if(strcasecompare(hs->name, name) &&
       (hs->type & type) &&
       (hs->request == request)) {
      amount++;
      pick = hs;
      e_pick = e;
    }
  }
  if(!amount)
    return CURLHE_MISSING;
  else if(nameindex >= amount)
    return CURLHE_BADINDEX;

  if(nameindex == amount - 1)
    /* if the last or only occurrence is what's asked for, then we know it */
    hs = pick;
  else {
    for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
      hs = Curl_node_elem(e);
      if(strcasecompare(hs->name, name) &&
         (hs->type & type) &&
         (hs->request == request) &&
         (match++ == nameindex)) {
        e_pick = e;
        break;
      }
    }
    if(!e) /* this should not happen */
      return CURLHE_MISSING;
  }
  /* this is the name we want */
  copy_header_external(hs, nameindex, amount, e_pick,
                       &data->state.headerout[0]);
  *hout = &data->state.headerout[0];
  return CURLHE_OK;
}